

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O0

CURLcode httpauth(Curl_easy *data,_Bool proxy,unsigned_long auth)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int local_2c;
  _Bool iestyle;
  _Bool authbits;
  unsigned_long uStack_28;
  int bitcheck;
  unsigned_long auth_local;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  uStack_28 = auth;
  if (auth != 0) {
    local_2c = 0;
    bVar1 = false;
    bVar3 = (auth & 0x10) != 0;
    if (proxy) {
      (data->state).authproxy.field_0x18 = (data->state).authproxy.field_0x18 & 0xfb | bVar3 << 2;
    }
    else {
      (data->state).authhost.field_0x18 = (data->state).authhost.field_0x18 & 0xfb | bVar3 << 2;
    }
    if ((auth & 0x10) != 0) {
      uStack_28 = auth & 0xffffffffffffffef | 2;
    }
    uStack_28 = uStack_28 & 0xfffffffffffffffb;
    do {
      if (0x1e < local_2c) goto LAB_00187509;
      bVar2 = (byte)local_2c;
      local_2c = local_2c + 1;
    } while ((uStack_28 & 1L << (bVar2 & 0x3f)) == 0);
    bVar1 = true;
LAB_00187509:
    if (!bVar1) {
      return CURLE_NOT_BUILT_IN;
    }
  }
  if (proxy) {
    (data->set).proxyauth = uStack_28;
  }
  else {
    (data->set).httpauth = uStack_28;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode httpauth(struct Curl_easy *data, bool proxy,
                         unsigned long auth)
{
  if(auth != CURLAUTH_NONE) {
    int bitcheck = 0;
    bool authbits = FALSE;
    /* the DIGEST_IE bit is only used to set a special marker, for all the
       rest we need to handle it as normal DIGEST */
    bool iestyle = !!(auth & CURLAUTH_DIGEST_IE);
    if(proxy)
      data->state.authproxy.iestyle = iestyle;
    else
      data->state.authhost.iestyle = iestyle;

    if(auth & CURLAUTH_DIGEST_IE) {
      auth |= CURLAUTH_DIGEST; /* set standard digest bit */
      auth &= ~CURLAUTH_DIGEST_IE; /* unset ie digest bit */
    }

    /* switch off bits we cannot support */
#ifndef USE_NTLM
    auth &= ~CURLAUTH_NTLM;    /* no NTLM support */
#endif
#ifndef USE_SPNEGO
    auth &= ~CURLAUTH_NEGOTIATE; /* no Negotiate (SPNEGO) auth without GSS-API
                                    or SSPI */
#endif

    /* check if any auth bit lower than CURLAUTH_ONLY is still set */
    while(bitcheck < 31) {
      if(auth & (1UL << bitcheck++)) {
        authbits = TRUE;
        break;
      }
    }
    if(!authbits)
      return CURLE_NOT_BUILT_IN; /* no supported types left! */
  }
  if(proxy)
    data->set.proxyauth = auth;
  else
    data->set.httpauth = auth;
  return CURLE_OK;
}